

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void tinygltf::SerializeGltfImage(Image *image,json *o)

{
  allocator local_31;
  string local_30;
  
  if ((image->uri)._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_30,"mimeType",&local_31);
    SerializeStringProperty(&local_30,&image->mimeType,o);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string((string *)&local_30,"bufferView",&local_31);
    SerializeNumberProperty<int>(&local_30,image->bufferView,o);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,"uri",&local_31);
    SerializeStringProperty(&local_30,&image->uri,o);
  }
  std::__cxx11::string::~string((string *)&local_30);
  if ((image->name)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_30,"name",&local_31);
    SerializeStringProperty(&local_30,&image->name,o);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((char)(image->extras).type_ != '\0') {
    std::__cxx11::string::string((string *)&local_30,"extras",&local_31);
    SerializeValue(&local_30,&image->extras,o);
    std::__cxx11::string::~string((string *)&local_30);
  }
  SerializeExtensionMap(&image->extensions,o);
  return;
}

Assistant:

static void SerializeGltfImage(Image &image, json &o) {
  // if uri empty, the mimeType and bufferview should be set
  if (image.uri.empty()) {
    SerializeStringProperty("mimeType", image.mimeType, o);
    SerializeNumberProperty<int>("bufferView", image.bufferView, o);
  } else {
    SerializeStringProperty("uri", image.uri, o);
  }

  if (image.name.size()) {
    SerializeStringProperty("name", image.name, o);
  }

  if (image.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", image.extras, o);
  }

  SerializeExtensionMap(image.extensions, o);
}